

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::ProcessByteCodeUsesInstr(BackwardPass *this,Instr *instr)

{
  Phase PVar1;
  Type TVar2;
  code *pcVar3;
  RegSlot RVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  undefined4 *puVar6;
  StackSym *pSVar7;
  Func *pFVar8;
  StackSym **ppSVar9;
  Type_conflict pBVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  
  bVar14 = instr->m_kind == InstrKindByteCodeUses;
  bVar15 = instr->m_opcode == ByteCodeUses;
  bVar12 = bVar15 && bVar14;
  if (!bVar15 || !bVar14) {
    return bVar12;
  }
  PVar1 = this->tag;
  if (PVar1 == CaptureByteCodeRegUsePhase) {
    ProcessByteCodeUsesDst(this,(ByteCodeUsesInstr *)instr);
    ProcessByteCodeUsesSrcs(this,(ByteCodeUsesInstr *)instr);
    return bVar12;
  }
  if (PVar1 != DeadStorePhase) {
    if (PVar1 == BackwardPhase) {
      pBVar5 = ProcessByteCodeUsesSrcs(this,(ByteCodeUsesInstr *)instr);
      if (pBVar5 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        return bVar12;
      }
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->currentBlock->upwardExposedUses,pBVar5);
      return bVar12;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar14 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x815,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar14) {
LAB_003d95a9:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    if (instr->m_opcode != ByteCodeUses) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar14 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                          ,0x816,"(instr->m_opcode == Js::OpCode::ByteCodeUses)",
                          "instr->m_opcode == Js::OpCode::ByteCodeUses");
      if (!bVar14) goto LAB_003d95a9;
      *puVar6 = 0;
    }
    if (this->tag != DeadStorePhase) goto LAB_003d9316;
  }
  bVar14 = SatisfyMarkTempObjectsConditions(this);
  if ((bVar14) &&
     (((this->currentBlock->field_0x18 & 2) != 0 || ((this->func->field_0x240 & 0x10) == 0)))) {
    if (this->isCollectionPass == true) {
      if ((this->func->field_0x240 & 0x10) == 0) {
        return bVar12;
      }
    }
    else {
      ObjectTempVerify::NotifyDeadByteCodeUses
                (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr);
    }
  }
LAB_003d9316:
  if ((this->func->field_0x240 & 0x10) != 0) {
    pSVar7 = ProcessByteCodeUsesDst(this,(ByteCodeUsesInstr *)instr);
    if ((pSVar7 != (StackSym *)0x0) &&
       (pFVar8 = StackSym::GetByteCodeFunc(pSVar7), pFVar8 == this->func)) {
      ppSVar9 = this->currentBlock->byteCodeRestoreSyms;
      RVar4 = StackSym::GetByteCodeRegSlot(pSVar7);
      ppSVar9[RVar4] = (StackSym *)0x0;
    }
    pBVar5 = ProcessByteCodeUsesSrcs(this,(ByteCodeUsesInstr *)instr);
    if ((pBVar5 != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
       (pBVar10 = pBVar5->head, pBVar10 != (Type_conflict)0x0)) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        uVar11 = (pBVar10->data).word;
        if (uVar11 != 0) {
          TVar2 = pBVar10->startIndex;
          uVar13 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar13);
            pSVar7 = SymTable::FindStackSym(this->func->m_symTable,TVar2 + (BVIndex)uVar13);
            if ((pSVar7->field_0x1a & 1) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar14 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                  ,0x83e,"(!stackSym->IsTypeSpec())","!stackSym->IsTypeSpec()");
              if (!bVar14) goto LAB_003d95a9;
              *puVar6 = 0;
            }
            pFVar8 = StackSym::GetByteCodeFunc(pSVar7);
            if (pFVar8 == this->func) {
              RVar4 = StackSym::GetByteCodeRegSlot(pSVar7);
              if (RVar4 == 0xffffffff) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar6 = 1;
                bVar14 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                    ,0x843,"(byteCodeRegSlot != Js::Constants::NoRegister)",
                                    "byteCodeRegSlot != Js::Constants::NoRegister");
                if (!bVar14) goto LAB_003d95a9;
                *puVar6 = 0;
              }
              ppSVar9 = this->currentBlock->byteCodeRestoreSyms;
              if (ppSVar9[RVar4] != pSVar7) {
                if (ppSVar9[RVar4] != (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar6 = 1;
                  bVar14 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                      ,0x847,
                                      "(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)"
                                      ,
                                      "Can\'t have two active lifetime for the same byte code register"
                                     );
                  if (!bVar14) goto LAB_003d95a9;
                  *puVar6 = 0;
                  ppSVar9 = this->currentBlock->byteCodeRestoreSyms;
                }
                ppSVar9[RVar4] = pSVar7;
              }
            }
            uVar11 = uVar11 & ~(1L << (uVar13 & 0x3f));
            uVar13 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
          } while (uVar11 != 0);
        }
        pBVar10 = pBVar10->next;
      } while (pBVar10 != (Type)0x0);
    }
    if (this->isCollectionPass != false) {
      return bVar12;
    }
    if ((*(long *)&instr[1].m_noLazyHelperAssert != 0) &&
       ((this->currentBlock->field_0x18 & 2) == 0)) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->currentBlock->upwardExposedFields,
                 *(BVIndex *)(*(long *)&instr[1].m_noLazyHelperAssert + 0x10));
    }
    if (this->currentPrePassLoop != (Loop *)0x0) {
      return bVar12;
    }
  }
  BasicBlock::RemoveInstr(this->currentBlock,instr);
  return bVar12;
}

Assistant:

bool
BackwardPass::ProcessByteCodeUsesInstr(IR::Instr * instr)
{
    if (!instr->IsByteCodeUsesInstr())
    {
        return false;
    }

    IR::ByteCodeUsesInstr * byteCodeUsesInstr = instr->AsByteCodeUsesInstr();

    if (this->tag == Js::BackwardPhase)
    {
        // FGPeeps inserts bytecodeuses instrs with srcs.  We need to look at them to set the proper
        // UpwardExposedUsed info and keep the defs alive.
        // The inliner inserts bytecodeuses instrs withs dsts, but we don't want to look at them for upwardExposedUsed
        // as it would cause real defs to look dead.  We use these for bytecodeUpwardExposedUsed info only, which is needed
        // in the dead-store pass only.
        //
        // Handle the source side.
        const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
        if (byteCodeUpwardExposedUsed != nullptr)
        {
            this->currentBlock->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
        }
    }
#if DBG
    else if (tag == Js::CaptureByteCodeRegUsePhase)
    {
        ProcessByteCodeUsesDst(byteCodeUsesInstr);
        ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
    }
#endif
    else
    {
        Assert(tag == Js::DeadStorePhase);
        Assert(instr->m_opcode == Js::OpCode::ByteCodeUses);
#if DBG
        if (this->DoMarkTempObjectVerify() && (this->currentBlock->isDead || !this->func->hasBailout))
        {
            if (IsCollectionPass())
            {
                if (!this->func->hasBailout)
                {
                    // Prevent byte code uses from being remove on collection pass for mark temp object verify
                    // if we don't have any bailout
                    return true;
                }
            }
            else
            {
                this->currentBlock->tempObjectVerifyTracker->NotifyDeadByteCodeUses(instr);
            }
        }
#endif

        if (this->func->hasBailout)
        {
            // Just collect the byte code uses, and remove the instruction
            // We are going backward, process the dst first and then the src
            StackSym *dstStackSym = ProcessByteCodeUsesDst(byteCodeUsesInstr);
#if DBG
            // We can only track first level function stack syms right now
            if (dstStackSym && dstStackSym->GetByteCodeFunc() == this->func)
            {
                this->currentBlock->byteCodeRestoreSyms[dstStackSym->GetByteCodeRegSlot()] = nullptr;
            }
#endif

            const BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = ProcessByteCodeUsesSrcs(byteCodeUsesInstr);
#if DBG
            if (byteCodeUpwardExposedUsed)
            {
                FOREACH_BITSET_IN_SPARSEBV(symId, byteCodeUpwardExposedUsed)
                {
                    StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                    Assert(!stackSym->IsTypeSpec());
                    // We can only track first level function stack syms right now
                    if (stackSym->GetByteCodeFunc() == this->func)
                    {
                        Js::RegSlot byteCodeRegSlot = stackSym->GetByteCodeRegSlot();
                        Assert(byteCodeRegSlot != Js::Constants::NoRegister);
                        if (this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] != stackSym)
                        {
                            AssertMsg(this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                                "Can't have two active lifetime for the same byte code register");
                            this->currentBlock->byteCodeRestoreSyms[byteCodeRegSlot] = stackSym;
                        }
                    }
                }
                NEXT_BITSET_IN_SPARSEBV;
            }
#endif

            if (IsCollectionPass())
            {
                return true;
            }

            PropertySym *propertySymUse = byteCodeUsesInstr->propertySymUse;
            if (propertySymUse && !this->currentBlock->isDead)
            {
                this->currentBlock->upwardExposedFields->Set(propertySymUse->m_id);
            }

            if (this->IsPrePass())
            {
                // Don't remove the instruction yet if we are in the prepass
                // But tell the caller we don't need to process the instruction any more
                return true;
            }
        }

        this->currentBlock->RemoveInstr(instr);
    }